

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_anydata(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  int iVar1;
  lys_module *plVar2;
  uint uVar3;
  char *pcVar4;
  int local_7c;
  uint local_64;
  uint local_54;
  char *ns;
  lyd_node *iter;
  lyd_node_anydata *any;
  char *buf;
  int options_local;
  int toplevel_local;
  lyd_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  buf._0_4_ = options;
  buf._4_4_ = toplevel;
  _options_local = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
     (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
    if (node_local._4_4_ == 0) {
      local_64 = 0;
    }
    else {
      local_64 = node_local._4_4_ * 2 - 2;
    }
    ly_print(plStack_10,"%*s<%s",(ulong)local_64,"",_options_local->schema->name);
  }
  else {
    plVar2 = lyd_node_module(_options_local);
    if (node_local._4_4_ == 0) {
      local_54 = 0;
    }
    else {
      local_54 = node_local._4_4_ * 2 - 2;
    }
    ly_print(plStack_10,"%*s<%s xmlns=\"%s\"",(ulong)local_54,"",_options_local->schema->name,
             plVar2->ns);
  }
  if (buf._4_4_ != 0) {
    xml_print_ns(plStack_10,_options_local,(uint)buf);
  }
  xml_print_attrs(plStack_10,_options_local,(uint)buf);
  if ((node[1].schema == (lys_node *)0x0) ||
     ((*(int *)&node->child == 0 && (*(char *)&(node[1].schema)->name == '\0')))) {
    pcVar4 = "";
    if (node_local._4_4_ != 0) {
      pcVar4 = "\n";
    }
    ly_print(plStack_10,"/>%s",pcVar4);
  }
  else {
    ly_print(plStack_10,">");
    switch(*(undefined4 *)&node->child) {
    case 0:
      lyxml_dump_text(plStack_10,(char *)node[1].schema);
      break;
    case 1:
    case 3:
    case 5:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                    ,0x206,
                    "void xml_print_anydata(struct lyout *, int, const struct lyd_node *, int, int)"
                   );
    case 2:
      if ('\0' < ly_log_level) {
        ly_log(LY_LLWRN,"Unable to print anydata content (type %d) as XML.",
               (ulong)*(uint *)&node->child);
      }
      break;
    case 4:
      ly_print(plStack_10,"%s",node[1].schema);
      break;
    case 8:
      uVar3 = 0;
      if (node_local._4_4_ != 0) {
        uVar3 = 0x22;
      }
      lyxml_print_mem((char **)&any,(lyxml_elem *)node[1].schema,uVar3 | 0x10);
      pcVar4 = "";
      if (node_local._4_4_ != 0) {
        pcVar4 = "\n";
      }
      ly_print(plStack_10,"%s%s",pcVar4,any);
      free(any);
      break;
    case 0x10:
      if (node[1].schema != (lys_node *)0x0) {
        if (node_local._4_4_ != 0) {
          ly_print(plStack_10,"\n");
        }
        for (ns = (char *)node[1].schema; ns != (char *)0x0; ns = *(char **)(ns + 0x18)) {
          if (node_local._4_4_ == 0) {
            local_7c = 0;
          }
          else {
            local_7c = node_local._4_4_ + 1;
          }
          xml_print_node(plStack_10,local_7c,(lyd_node *)ns,0,(uint)buf & 0xfffffefe);
        }
      }
    }
    pcVar4 = "";
    if (node_local._4_4_ != 0) {
      pcVar4 = "\n";
    }
    ly_print(plStack_10,"</%s>%s",_options_local->schema->name,pcVar4);
  }
  return;
}

Assistant:

static void
xml_print_anydata(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    char *buf;
    struct lyd_node_anydata *any = (struct lyd_node_anydata *)node;
    struct lyd_node *iter;
    const char *ns;

    if (toplevel || !node->parent || nscmp(node, node->parent)) {
        /* print "namespace" */
        ns = lyd_node_module(node)->ns;
        ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
    } else {
        ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
    }

    if (toplevel) {
        xml_print_ns(out, node, options);
    }
    xml_print_attrs(out, node, options);
    if (!(void*)any->value.tree || (any->value_type == LYD_ANYDATA_CONSTSTRING && !any->value.str[0])) {
        /* no content */
        ly_print(out, "/>%s", level ? "\n" : "");
    } else {
        /* close opening tag ... */
        ly_print(out, ">");
        /* ... and print anydata content */
        switch (any->value_type) {
        case LYD_ANYDATA_CONSTSTRING:
            lyxml_dump_text(out, any->value.str);
            break;
        case LYD_ANYDATA_DATATREE:
            if (any->value.tree) {
                if (level) {
                    ly_print(out, "\n");
                }
                LY_TREE_FOR(any->value.tree, iter) {
                    xml_print_node(out, level ? level + 1 : 0, iter, 0, (options & ~(LYP_WITHSIBLINGS | LYP_NETCONF)));
                }
            }
            break;
        case LYD_ANYDATA_XML:
            lyxml_print_mem(&buf, any->value.xml, (level ? LYXML_PRINT_FORMAT | LYXML_PRINT_NO_LAST_NEWLINE : 0)
                                                   | LYXML_PRINT_SIBLINGS);
            ly_print(out, "%s%s", level ? "\n" : "", buf);
            free(buf);
            break;
        case LYD_ANYDATA_SXML:
            /* print without escaping special characters */
            ly_print(out, "%s", any->value.str);
            break;
        case LYD_ANYDATA_JSON:
            /* JSON format is not supported */
            LOGWRN("Unable to print anydata content (type %d) as XML.", any->value_type);
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_SXMLD:
        case LYD_ANYDATA_JSOND:
            /* dynamic strings are used only as input parameters */
            assert(0);
            break;
        }

        /* closing tag */
        ly_print(out, "</%s>%s", node->schema->name, level ? "\n" : "");
    }
}